

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_tls.cc
# Opt level: O2

int aead_tls_get_iv(EVP_AEAD_CTX *ctx,uint8_t **out_iv,size_t *out_iv_len)

{
  uint uVar1;
  
  uVar1 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)&ctx->state);
  if (1 < uVar1) {
    *out_iv = (uint8_t *)((long)&ctx->state + 0x34);
    *out_iv_len = (ulong)uVar1;
  }
  else {
    ERR_put_error(0x1e,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                  ,0x1bd);
  }
  return (uint)(1 < uVar1);
}

Assistant:

static int aead_tls_get_iv(const EVP_AEAD_CTX *ctx, const uint8_t **out_iv,
                           size_t *out_iv_len) {
  const AEAD_TLS_CTX *tls_ctx = (AEAD_TLS_CTX *)&ctx->state;
  const size_t iv_len = EVP_CIPHER_CTX_iv_length(&tls_ctx->cipher_ctx);
  if (iv_len <= 1) {
    OPENSSL_PUT_ERROR(CIPHER, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  *out_iv = tls_ctx->cipher_ctx.iv;
  *out_iv_len = iv_len;
  return 1;
}